

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall
Centaurus::NFA<unsigned_char>::concat(NFA<unsigned_char> *this,NFA<unsigned_char> *nfa)

{
  vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  *this_00;
  pointer this_01;
  int offset_value;
  NFABaseState<unsigned_char,_int> local_50;
  
  this_00 = &(this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states;
  this_01 = (nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
            super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  offset_value = (int)(((long)(this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).
                              m_states.
                              super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).
                             m_states.
                             super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x28) + -1;
  while (this_01 = this_01 + 1,
        this_01 !=
        (nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
        super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    NFABaseState<unsigned_char,_int>::offset(&local_50,this_01,offset_value);
    std::
    vector<Centaurus::NFABaseState<unsigned_char,int>,std::allocator<Centaurus::NFABaseState<unsigned_char,int>>>
    ::emplace_back<Centaurus::NFABaseState<unsigned_char,int>>
              ((vector<Centaurus::NFABaseState<unsigned_char,int>,std::allocator<Centaurus::NFABaseState<unsigned_char,int>>>
                *)this_00,&local_50);
    NFABaseState<unsigned_char,_int>::~NFABaseState(&local_50);
  }
  NFABaseState<unsigned_char,_int>::rebase_transitions
            ((this_00->
             super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start + offset_value,
             (nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,offset_value);
  return;
}

Assistant:

void concat(const NFA<TCHAR>& nfa)
    {
        int initial_size = m_states.size();

        auto i = nfa.m_states.cbegin() + 1;

        for (; i != nfa.m_states.cend(); i++)
        {
            m_states.push_back(i->offset(initial_size - 1));
        }

        m_states[initial_size - 1].rebase_transitions(nfa.m_states[0], initial_size - 1);
    }